

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
poly::
vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
::push_back_new_elem<Impl1,Impl1>
          (vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
           *this,Impl1 *param_2)

{
  undefined8 *puVar1;
  bool bVar2;
  Impl1 *this_00;
  
  bVar2 = vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
          ::can_construct_new_elem
                    ((vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
                      *)this,0x30,8);
  if (!bVar2) {
    __assert_fail("can_construct_new_elem(s, a)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                  ,0x5a9,
                  "void poly::vector<Interface, custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>, CloningPolicy = poly::delegate_cloning_policy<Interface, custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>>, T = Impl1, Args = <Impl1>]"
                 );
  }
  if (7 < *(ulong *)(this + 0x20)) {
    this_00 = (Impl1 *)vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
                       ::next_aligned_storage
                                 ((vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
                                   *)this,*(ulong *)(this + 0x20));
    Impl1::Impl1(this_00,param_2);
    puVar1 = *(undefined8 **)(this + 0x10);
    *puVar1 = delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>
              ::clone_func<Impl1>;
    puVar1[1] = this_00;
    puVar1[2] = this_00;
    puVar1[3] = 0x30;
    puVar1[4] = 8;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 0x28;
    return;
  }
  __assert_fail("_align_max >= a",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                ,0x5aa,
                "void poly::vector<Interface, custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>, CloningPolicy = poly::delegate_cloning_policy<Interface, custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>>, T = Impl1, Args = <Impl1>]"
               );
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem(type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s = sizeof(T);
    constexpr auto a = alignof(T);
    using traits     = typename allocator_traits ::template rebind_traits<T>;

    assert(can_construct_new_elem(s, a));
    assert(_align_max >= a);
    auto nas = next_aligned_storage(_align_max);
    auto obj_ptr
        = base().construct(static_cast<typename traits::pointer>(nas), std::forward<Args>(args)...);
    *_free_elem = elem_ptr(type_tag<T> {}, nas, obj_ptr);
    ++_free_elem;
}